

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_decorations.cpp
# Opt level: O0

void spvtools::val::anon_unknown_0::ComputeMemberConstraintsForStruct
               (MemberConstraints *constraints,uint32_t struct_id,LayoutConstraints *inherited,
               ValidationState_t *vstate)

{
  unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
  *this;
  bool bVar1;
  uint32_t uVar2;
  Decoration DVar3;
  Op OVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  pointer pDVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  const_reference pvVar8;
  Instruction *this_01;
  Op opcode;
  Instruction *member_type_inst;
  _Self _Stack_78;
  value_type member_type_id;
  const_iterator decoration;
  FieldDecorationsIter member_decorations;
  LayoutConstraints *constraint;
  uint32_t numMembers;
  uint32_t memberIdx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_30;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *members;
  ValidationState_t *vstate_local;
  LayoutConstraints *inherited_local;
  MemberConstraints *pMStack_10;
  uint32_t struct_id_local;
  MemberConstraints *constraints_local;
  
  members = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)vstate;
  vstate_local = (ValidationState_t *)inherited;
  inherited_local._4_4_ = struct_id;
  pMStack_10 = constraints;
  if (constraints == (MemberConstraints *)0x0) {
    __assert_fail("constraints",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                  ,0x410,
                  "void spvtools::val::(anonymous namespace)::ComputeMemberConstraintsForStruct(MemberConstraints *, uint32_t, const LayoutConstraints &, ValidationState_t &)"
                 );
  }
  getStructMembers((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numMembers,struct_id,
                   vstate);
  local_30 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numMembers;
  constraint._4_4_ = 0;
  sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(local_30);
  constraint._0_4_ = (uint)sVar5;
  do {
    this = pMStack_10;
    if ((uint)constraint <= constraint._4_4_) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&numMembers);
      return;
    }
    member_decorations.end._M_node =
         (_Base_ptr)
         std::make_pair<unsigned_int&,unsigned_int&>
                   ((uint *)((long)&inherited_local + 4),(uint *)((long)&constraint + 4));
    pmVar6 = std::
             unordered_map<std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints,_spvtools::val::(anonymous_namespace)::PairHash,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_spvtools::val::(anonymous_namespace)::LayoutConstraints>_>_>
             ::operator[](this,(key_type *)&member_decorations.end);
    *pmVar6 = (mapped_type)vstate_local->context_;
    _decoration = ValidationState_t::id_member_decorations
                            ((ValidationState_t *)members,inherited_local._4_4_,constraint._4_4_);
    _Stack_78._M_node = decoration._M_node;
    while (bVar1 = std::operator!=(&stack0xffffffffffffff88,&member_decorations.begin), bVar1) {
      pDVar7 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator->
                         (&stack0xffffffffffffff88);
      uVar2 = Decoration::struct_member_index(pDVar7);
      if (uVar2 != constraint._4_4_) {
        __assert_fail("decoration->struct_member_index() == (int)memberIdx",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_decorations.cpp"
                      ,0x41b,
                      "void spvtools::val::(anonymous namespace)::ComputeMemberConstraintsForStruct(MemberConstraints *, uint32_t, const LayoutConstraints &, ValidationState_t &)"
                     );
      }
      pDVar7 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator->
                         (&stack0xffffffffffffff88);
      DVar3 = Decoration::dec_type(pDVar7);
      if (DVar3 == DecorationRowMajor) {
        pmVar6->majorness = kRowMajor;
      }
      else if (DVar3 == ColMajor) {
        pmVar6->majorness = kColumnMajor;
      }
      else if (DVar3 == DecorationMatrixStride) {
        pDVar7 = std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator->
                           (&stack0xffffffffffffff88);
        this_00 = Decoration::params(pDVar7);
        pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
        pmVar6->matrix_stride = *pvVar8;
      }
      std::_Rb_tree_const_iterator<spvtools::val::Decoration>::operator++(&stack0xffffffffffffff88);
    }
    pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_30,(ulong)constraint._4_4_);
    uVar2 = *pvVar8;
    this_01 = ValidationState_t::FindDef((ValidationState_t *)members,uVar2);
    OVar4 = Instruction::opcode(this_01);
    if (OVar4 - OpTypeArray < 2) {
      ComputeMemberConstraintsForArray
                (pMStack_10,uVar2,(LayoutConstraints *)vstate_local,(ValidationState_t *)members);
    }
    else if (OVar4 == OpTypeStruct) {
      ComputeMemberConstraintsForStruct
                (pMStack_10,uVar2,(LayoutConstraints *)vstate_local,(ValidationState_t *)members);
    }
    constraint._4_4_ = constraint._4_4_ + 1;
  } while( true );
}

Assistant:

void ComputeMemberConstraintsForStruct(MemberConstraints* constraints,
                                       uint32_t struct_id,
                                       const LayoutConstraints& inherited,
                                       ValidationState_t& vstate) {
  assert(constraints);
  const auto& members = getStructMembers(struct_id, vstate);
  for (uint32_t memberIdx = 0, numMembers = uint32_t(members.size());
       memberIdx < numMembers; memberIdx++) {
    LayoutConstraints& constraint =
        (*constraints)[std::make_pair(struct_id, memberIdx)];
    constraint = inherited;
    auto member_decorations =
        vstate.id_member_decorations(struct_id, memberIdx);
    for (auto decoration = member_decorations.begin;
         decoration != member_decorations.end; ++decoration) {
      assert(decoration->struct_member_index() == (int)memberIdx);
      switch (decoration->dec_type()) {
        case spv::Decoration::RowMajor:
          constraint.majorness = kRowMajor;
          break;
        case spv::Decoration::ColMajor:
          constraint.majorness = kColumnMajor;
          break;
        case spv::Decoration::MatrixStride:
          constraint.matrix_stride = decoration->params()[0];
          break;
        default:
          break;
      }
    }

    // Now recurse
    auto member_type_id = members[memberIdx];
    const auto member_type_inst = vstate.FindDef(member_type_id);
    const auto opcode = member_type_inst->opcode();
    switch (opcode) {
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
        ComputeMemberConstraintsForArray(constraints, member_type_id, inherited,
                                         vstate);
        break;
      case spv::Op::OpTypeStruct:
        ComputeMemberConstraintsForStruct(constraints, member_type_id,
                                          inherited, vstate);
        break;
      default:
        break;
    }
  }
}